

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O3

uint aom_highbd_8_obmc_variance4x4_sse4_1
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int *piVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  puVar3 = (undefined8 *)((long)pre * 2);
  uVar2 = 0xfffffffffffffffc;
  auVar7 = pmovsxwd(in_XMM2,0x800080008000800);
  auVar5 = (undefined1  [16])0x0;
  auVar6 = (undefined1  [16])0x0;
  do {
    auVar8 = pmovzxwd(in_XMM3,*puVar3);
    piVar1 = wsrc + uVar2 + 4;
    auVar8 = pmaddwd(auVar8,*(undefined1 (*) [16])(mask + uVar2 + 4));
    iVar10 = *piVar1 - auVar8._0_4_;
    iVar11 = piVar1[1] - auVar8._4_4_;
    iVar12 = piVar1[2] - auVar8._8_4_;
    iVar13 = piVar1[3] - auVar8._12_4_;
    auVar9._0_4_ = (iVar10 >> 0x1f) + iVar10 + auVar7._0_4_ >> 0xc;
    auVar9._4_4_ = (iVar11 >> 0x1f) + iVar11 + auVar7._4_4_ >> 0xc;
    auVar9._8_4_ = (iVar12 >> 0x1f) + iVar12 + auVar7._8_4_ >> 0xc;
    auVar9._12_4_ = (iVar13 >> 0x1f) + iVar13 + auVar7._12_4_ >> 0xc;
    auVar4._0_4_ = auVar6._0_4_ + auVar9._0_4_;
    auVar4._4_4_ = auVar6._4_4_ + auVar9._4_4_;
    auVar4._8_4_ = auVar6._8_4_ + auVar9._8_4_;
    auVar4._12_4_ = auVar6._12_4_ + auVar9._12_4_;
    in_XMM3 = pmulld(auVar9,auVar9);
    auVar8._0_4_ = auVar5._0_4_ + in_XMM3._0_4_;
    auVar8._4_4_ = auVar5._4_4_ + in_XMM3._4_4_;
    auVar8._8_4_ = auVar5._8_4_ + in_XMM3._8_4_;
    auVar8._12_4_ = auVar5._12_4_ + in_XMM3._12_4_;
    uVar2 = uVar2 + 4;
    puVar3 = (undefined8 *)((long)puVar3 + (long)(pre_stride + -4) * 2 + 8);
    auVar5 = auVar8;
    auVar6 = auVar4;
  } while (uVar2 < 0xc);
  auVar5 = phaddd(auVar4,auVar4);
  auVar6 = phaddd(auVar5,auVar5);
  auVar5 = phaddd(auVar8,auVar8);
  auVar5 = phaddd(auVar5,auVar5);
  *sse = auVar5._0_4_;
  return auVar5._0_4_ - (int)((ulong)((long)auVar6._0_4_ * (long)auVar6._0_4_) >> 4);
}

Assistant:

static inline void highbd_8_obmc_variance(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  }
  *sum = (int)sum64;
  *sse = (unsigned int)sse64;
}